

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_test.cpp
# Opt level: O2

void __thiscall parse_::test_method(parse_ *this)

{
  pointer *ppbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  undefined4 uVar3;
  long lVar4;
  argument_order aVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  allocator local_828;
  allocator local_827;
  allocator local_826;
  allocator local_825;
  allocator local_824;
  allocator local_823;
  allocator local_822;
  allocator local_821;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  local_800;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  undefined1 local_798 [32];
  char arg2 [15];
  char arg1 [10];
  char arg0 [6];
  undefined2 uStack_732;
  char arg3 [2];
  undefined2 uStack_716;
  char arg3_1 [2];
  char *argv_1 [5];
  char *argv [5];
  string local_5a8 [352];
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  type local_268;
  type local_238;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  cmd;
  undefined8 uVar6;
  
  std::__cxx11::string::string((string *)&local_848,"parse",&local_821);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&args.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)args.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(&local_800,&local_848,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args);
  std::__cxx11::string::string((string *)&args_1,"help",&local_822);
  std::__cxx11::string::string((string *)local_798,"",&local_823);
  std::__cxx11::string::string((string *)arg2,"produce help message",&local_824);
  long_names._M_len = 1;
  long_names._M_array = (iterator)&args_1;
  nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>::
  flag<(char)104,void>
            ((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>,_std::tuple<>,_std::tuple<>_>
              *)argv_1,&local_800,(initializer_list<char>)ZEXT816(0),long_names,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_798,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arg2,normal);
  std::__cxx11::string::string((string *)arg1,"optimization",&local_825);
  std::__cxx11::string::string((string *)arg0,"N",&local_826);
  std::__cxx11::string::string((string *)arg3,"optimization level",&local_827);
  uVar6 = 1;
  long_names_00._M_len = 1;
  long_names_00._M_array = (iterator)arg1;
  nonsugar::
  basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>>,std::tuple<>,std::tuple<>>
  ::flag<(char)111,int>
            ((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<>_>
              *)argv,argv_1,(initializer_list<char>)ZEXT816(0),long_names_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arg0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arg3,normal);
  std::__cxx11::string::string((string *)arg3_1,"INPUT-FILE",&local_828);
  nonsugar::
  basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<>>
  ::argument<(char)105,std::__cxx11::string>
            (&cmd,argv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arg3_1);
  std::__cxx11::string::~string((string *)arg3_1);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'h',_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'o',_int>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<>_>
                    *)argv);
  std::__cxx11::string::~string((string *)arg3);
  std::__cxx11::string::~string((string *)arg0);
  std::__cxx11::string::~string((string *)arg1);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'h',_void>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>_>,_std::tuple<>,_std::tuple<>_>
                    *)argv_1);
  std::__cxx11::string::~string((string *)arg2);
  std::__cxx11::string::~string((string *)local_798);
  std::__cxx11::string::~string((string *)&args_1);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_800);
  std::__cxx11::string::~string((string *)&args);
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::string((string *)argv,"input.cpp",(allocator *)argv_1);
  std::__cxx11::string::string((string *)(argv + 4),"--optimization",(allocator *)&local_800);
  std::__cxx11::string::string(local_5a8,"4",(allocator *)&local_848);
  __l._M_len = 3;
  __l._M_array = (iterator)argv;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&args,__l,(allocator_type *)&args_1);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)argv + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  nonsugar::
  parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>
            (&local_238,
             (nonsugar *)
             args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,&cmd.m_header,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x0,(argument_order)uVar6);
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'h',_void>,_nonsugar::detail::option_pair<char,_'o',_int>,_nonsugar::detail::option_pair<char,_'i',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~option_map(&local_238);
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_278,0x20);
  local_848._M_dataplus._M_p = local_848._M_dataplus._M_p & 0xffffffffffffff00;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)argv_1,(value_expr<bool> *)&local_848,false);
  local_800.m_header._M_dataplus._M_p = "false";
  local_800.m_header._M_string_length = 0x1381af;
  argv[1] = (char *)((ulong)argv[1] & 0xffffffffffffff00);
  argv[0] = (char *)&PTR__lazy_ostream_00145d28;
  argv[2] = (char *)&boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_290 = "";
  aVar5 = 0xe;
  argv[3] = (char *)&local_800;
  boost::test_tools::tt_detail::report_assertion(argv_1,argv,&local_298,0x20,1,0xe,0);
  boost::detail::shared_count::~shared_count((shared_count *)(argv_1 + 2));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  builtin_strncpy(arg0,"parse",6);
  uVar3 = arg0._0_4_;
  _arg0 = (pointer)CONCAT44(stack0xfffffffffffff8cc,uVar3);
  builtin_strncpy(arg1,"input.cpp",10);
  builtin_strncpy(arg2,"--optimization",0xf);
  _arg3 = CONCAT22(uStack_716,0x34);
  argv[0] = arg0;
  argv[1] = arg1;
  argv[3] = arg3;
  argv[4] = (char *)0x0;
  argv[2] = arg2;
  nonsugar::
  parse<char*const*,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>
            (&local_268,(nonsugar *)(argv + 1),argv + 4,(char **)&cmd,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x0,aVar5);
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'h',_void>,_nonsugar::detail::option_pair<char,_'o',_int>,_nonsugar::detail::option_pair<char,_'i',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~option_map(&local_268);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d8,0x2d);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)args.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&local_800,(value_expr<bool> *)&args,false);
  local_848._M_dataplus._M_p = "false";
  local_848._M_string_length = 0x1381af;
  argv_1[1] = (char *)((ulong)argv_1[1] & 0xffffffffffffff00);
  argv_1[0] = (char *)&PTR__lazy_ostream_00145d28;
  argv_1[2] = (char *)&boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_2f0 = "";
  uVar6 = 0xe;
  argv_1[3] = (char *)&local_848;
  boost::test_tools::tt_detail::report_assertion(&local_800,argv_1,&local_2f8,0x2d,1,0xe,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_800.m_header.field_2._M_allocated_capacity);
  std::__cxx11::string::string((string *)argv,"input.cpp",(allocator *)argv_1);
  std::__cxx11::string::string((string *)(argv + 4),"--optimization",(allocator *)&local_800);
  std::__cxx11::string::string(local_5a8,"4",(allocator *)&local_848);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)argv;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&args_1,__l_00,(allocator_type *)&args);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)argv + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  begin._M_current._1_7_ =
       args_1.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._1_7_;
  begin._M_current._0_1_ =
       args_1.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_1_;
  nonsugar::
  parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>
            ((type *)argv,
             (nonsugar *)
             args_1.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,begin,&cmd.m_header,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x1,(argument_order)uVar6);
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_338,0x35);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(args.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,argv[0] == (char *)0x0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&local_800,(value_expr<bool> *)&args,false);
  local_848._M_dataplus._M_p = "!opts.has<\'h\'>()";
  local_848._M_string_length = 0x13822b;
  argv_1[1] = (char *)((ulong)argv_1[1] & 0xffffffffffffff00);
  argv_1[0] = (char *)&PTR__lazy_ostream_00145d28;
  argv_1[2] = (char *)&boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_350 = "";
  argv_1[3] = (char *)&local_848;
  boost::test_tools::tt_detail::report_assertion(&local_800,argv_1,&local_358,0x35,1,0xe,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_800.m_header.field_2._M_allocated_capacity);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_368,0x36);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(4,*(undefined4 *)argv[2]);
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_int,_boost::test_tools::assertion::op::EQ<int,_int,_void>_>
  ::evaluate((assertion_result *)&local_800,
             (binary_expr<boost::test_tools::assertion::value_expr<int>,_int,_boost::test_tools::assertion::op::EQ<int,_int,_void>_>
              *)&args,false);
  local_848._M_dataplus._M_p = "opts.get<\'o\'>() == 4";
  local_848._M_string_length = 0x138240;
  argv_1[1] = (char *)((ulong)argv_1[1] & 0xffffffffffffff00);
  argv_1[0] = (char *)&PTR__lazy_ostream_00145d28;
  argv_1[2] = (char *)&boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_380 = "";
  argv_1[3] = (char *)&local_848;
  boost::test_tools::tt_detail::report_assertion(&local_800,argv_1,&local_388,0x36,1,0xe,0);
  paVar2 = &local_800.m_header.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&paVar2->_M_allocated_capacity);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_398,0x37);
  std::__cxx11::string::string((string *)&local_848,(string *)argv[4]);
  local_800.m_header.field_2._M_allocated_capacity = local_848.field_2._M_allocated_capacity;
  argv_1[1] = (char *)local_848._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p == &local_848.field_2) {
    local_800.m_header.field_2._8_8_ = local_848.field_2._8_8_;
    local_848._M_dataplus._M_p = (pointer)paVar2;
  }
  local_848._M_string_length = 0;
  local_848.field_2._M_allocated_capacity =
       local_848.field_2._M_allocated_capacity & 0xffffffffffffff00;
  argv_1[0] = local_848._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p == paVar2) {
    argv_1[3] = (char *)local_800.m_header.field_2._8_8_;
    argv_1[0] = (char *)(argv_1 + 2);
  }
  local_800.m_header._M_string_length = 0;
  local_800.m_header.field_2._M_allocated_capacity =
       local_800.m_header.field_2._M_allocated_capacity & 0xffffffffffffff00;
  argv_1[4] = "input.cpp";
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  local_800.m_header._M_dataplus._M_p = (pointer)paVar2;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_(&)[10],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_void>_>
  ::evaluate((assertion_result *)local_798,
             (binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_(&)[10],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_void>_>
              *)argv_1,false);
  arg2[0] = 'A';
  arg2[1] = -0x7e;
  arg2[2] = '\x13';
  arg2[3] = '\0';
  arg2[4] = '\0';
  arg2[5] = '\0';
  arg2[6] = '\0';
  arg2[7] = '\0';
  arg2[8] = '_';
  arg2[9] = -0x7e;
  arg2[10] = '\x13';
  arg2[0xb] = '\0';
  arg2[0xc] = '\0';
  arg2[0xd] = '\0';
  arg2[0xe] = '\0';
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)args.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00145d28;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_3b0 = "";
  aVar5 = 0xe;
  boost::test_tools::tt_detail::report_assertion(local_798,&args,&local_3b8,0x37,1,0xe,0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_798 + 0x10));
  std::__cxx11::string::~string((string *)argv_1);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string((string *)&local_848);
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'h',_void>,_nonsugar::detail::option_pair<char,_'o',_int>,_nonsugar::detail::option_pair<char,_'i',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~option_map((option_map<char,_nonsugar::detail::option_pair<char,__h_,_void>,_nonsugar::detail::option_pair<char,__o_,_int>,_nonsugar::detail::option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)argv);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args_1);
  _arg3 = 0x73726170;
  _arg0 = (pointer)0x70632e7475706e69;
  builtin_strncpy(arg1,"--optimiza",10);
  arg3_1[0] = '4';
  arg3_1[1] = '\0';
  argv_1[0] = arg3;
  argv_1[1] = arg0;
  argv_1[2] = arg1;
  argv_1[3] = arg3_1;
  argv_1[4] = (char *)0x0;
  nonsugar::
  parse<char*const*,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)104,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)111,int>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)105,std::__cxx11::string>>>>
            ((type *)argv,(nonsugar *)(argv_1 + 1),argv_1 + 4,(char **)&cmd,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__h_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__o_,_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x1,aVar5);
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3c8,0x40);
  ppbVar1 = &args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(args_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,argv[0] == (char *)0x0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&local_848,(value_expr<bool> *)&args_1,false);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_202e4;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x13822b;
  local_800.m_header._M_string_length = local_800.m_header._M_string_length & 0xffffffffffffff00;
  local_800.m_header._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00145d28;
  local_800.m_header.field_2._M_allocated_capacity =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_3e0 = "";
  local_800.m_header.field_2._8_8_ = &args;
  boost::test_tools::tt_detail::report_assertion(&local_848,&local_800,&local_3e8,0x40,1,0xe,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_848.field_2._M_allocated_capacity);
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3f8,0x41);
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(4,*(undefined4 *)argv[2]);
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_int,_boost::test_tools::assertion::op::EQ<int,_int,_void>_>
  ::evaluate((assertion_result *)&local_848,
             (binary_expr<boost::test_tools::assertion::value_expr<int>,_int,_boost::test_tools::assertion::op::EQ<int,_int,_void>_>
              *)&args_1,false);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_202fd;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x138240;
  local_800.m_header._M_string_length = local_800.m_header._M_string_length & 0xffffffffffffff00;
  local_800.m_header._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00145d28;
  local_800.m_header.field_2._M_allocated_capacity =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_410 = "";
  local_800.m_header.field_2._8_8_ = &args;
  boost::test_tools::tt_detail::report_assertion(&local_848,&local_800,&local_418,0x41,1,0xe,0);
  paVar2 = &local_848.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&paVar2->_M_allocated_capacity);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_428,0x42);
  std::__cxx11::string::string((string *)&args,(string *)argv[4]);
  local_800.m_header.field_2._M_allocated_capacity =
       (size_type)
       args.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_800.m_header._M_string_length =
       (size_type)
       args.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_800.m_header._M_dataplus._M_p = (pointer)paVar2;
  uVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)arg2;
  if (args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    local_800.m_header._M_dataplus._M_p =
         (pointer)args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = local_848.field_2._8_8_;
  }
  local_848.field_2._8_8_ = uVar6;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)args.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800.m_header._M_dataplus._M_p == paVar2) {
    local_800.m_header.field_2._8_8_ = local_848.field_2._8_8_;
    local_800.m_header._M_dataplus._M_p = (pointer)&local_800.m_header.field_2;
  }
  local_848._M_string_length = 0;
  local_848.field_2._M_allocated_capacity =
       local_800.m_header.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_800.m_footer._M_dataplus._M_p = "input.cpp";
  local_848._M_dataplus._M_p = (pointer)paVar2;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_(&)[10],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_void>_>
  ::evaluate((assertion_result *)local_798,
             (binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_(&)[10],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_void>_>
              *)&local_800,false);
  arg2[0] = 'A';
  arg2[1] = -0x7e;
  arg2[2] = '\x13';
  arg2[3] = '\0';
  arg2[4] = '\0';
  arg2[5] = '\0';
  arg2[6] = '\0';
  arg2[7] = '\0';
  arg2[8] = '_';
  arg2[9] = -0x7e;
  arg2[10] = '\x13';
  arg2[0xb] = '\0';
  arg2[0xc] = '\0';
  arg2[0xd] = '\0';
  arg2[0xe] = '\0';
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00145d28;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&boost::unit_test::lazy_ostream::inst;
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/parse_test.cpp";
  local_440 = "";
  boost::test_tools::tt_detail::report_assertion(local_798,&args_1,&local_448,0x42,1,0xe,0);
  boost::detail::shared_count::~shared_count((shared_count *)(local_798 + 0x10));
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::~string((string *)&args);
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'h',_void>,_nonsugar::detail::option_pair<char,_'o',_int>,_nonsugar::detail::option_pair<char,_'i',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~option_map((option_map<char,_nonsugar::detail::option_pair<char,__h_,_void>,_nonsugar::detail::option_pair<char,__o_,_int>,_nonsugar::detail::option_pair<char,__i_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)argv);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'h',_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'o',_int>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'i',_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~basic_command(&cmd);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(parse_)
{
    using namespace nonsugar;
    auto const cmd = command<char>("parse")
        .flag<'h'>({}, {"help"}, "", "produce help message")
        .flag<'o', int>({}, {"optimization"}, "N", "optimization level")
        .argument<'i', std::string>("INPUT-FILE")
        ;
    {
        std::vector<std::string> const args = { "input.cpp", "--optimization", "4" };
        try {
            parse(args.begin(), args.end(), cmd);
            BOOST_TEST(false);
        } catch (error const &e) {
            BOOST_TEST(e.message() == "parse: unrecognized argument: --optimization");
        }
    }
    {
        char arg0[] = "parse";
        char arg1[] = "input.cpp";
        char arg2[] = "--optimization";
        char arg3[] = "4";
        char *argv[] = { arg0, arg1, arg2, arg3, nullptr };
        try {
            parse(4, argv, cmd);
            BOOST_TEST(false);
        } catch (error const &e) {
            BOOST_TEST(e.message() == "parse: unrecognized argument: --optimization");
        }
    }
    {
        std::vector<std::string> const args = { "input.cpp", "--optimization", "4" };
        auto const opts = parse(args.begin(), args.end(), cmd, argument_order::flexible);
        BOOST_TEST(!opts.has<'h'>());
        BOOST_TEST(opts.get<'o'>() == 4);
        BOOST_TEST(opts.get<'i'>() == "input.cpp");
    }
    {
        char arg0[] = "parse";
        char arg1[] = "input.cpp";
        char arg2[] = "--optimization";
        char arg3[] = "4";
        char *argv[] = { arg0, arg1, arg2, arg3, nullptr };
        auto const opts = parse(4, argv, cmd, argument_order::flexible);
        BOOST_TEST(!opts.has<'h'>());
        BOOST_TEST(opts.get<'o'>() == 4);
        BOOST_TEST(opts.get<'i'>() == "input.cpp");
    }
}